

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O1

uint8_t * __thiscall
google::protobuf::internal::ExtensionSet::InternalSerializeMessageSetWithCachedSizesToArray
          (ExtensionSet *this,MessageLite *extendee,uint8_t *target,EpsCopyOutputStream *stream)

{
  uint16_t uVar1;
  anon_class_32_4_5f7794cc func;
  KeyValue *pKVar2;
  KeyValue *pKVar3;
  uint8_t *local_78;
  uint8_t **local_70;
  MessageLite *pMStack_68;
  EpsCopyOutputStream *local_60;
  ExtensionSet *pEStack_58;
  anon_class_32_4_5f7794cc local_50;
  
  local_70 = &local_78;
  uVar1 = this->flat_size_;
  pKVar3 = (this->map_).flat;
  local_78 = target;
  pMStack_68 = extendee;
  local_60 = stream;
  pEStack_58 = this;
  if ((long)(short)uVar1 < 0) {
    func.extendee = extendee;
    func.target = local_70;
    func.stream = stream;
    func.extension_set = this;
    ForEach<std::_Rb_tree_iterator<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>,google::protobuf::internal::ExtensionSet::InternalSerializeMessageSetWithCachedSizesToArray(google::protobuf::MessageLite_const*,unsigned_char*,google::protobuf::io::EpsCopyOutputStream*)const::__0>
              (&local_50,(ExtensionSet *)(pKVar3->second).descriptor,
               (_Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
                )&pKVar3->second,
               (_Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
                )stream,func);
  }
  else if (uVar1 != 0) {
    pKVar2 = pKVar3 + (short)uVar1;
    do {
      local_78 = Extension::InternalSerializeMessageSetItemWithCachedSizesToArray
                           (&pKVar3->second,extendee,this,pKVar3->first,local_78,stream);
      pKVar3 = pKVar3 + 1;
    } while (pKVar3 != pKVar2);
  }
  return local_78;
}

Assistant:

uint8_t* ExtensionSet::InternalSerializeMessageSetWithCachedSizesToArray(
    const MessageLite* extendee, uint8_t* target,
    io::EpsCopyOutputStream* stream) const {
  const ExtensionSet* extension_set = this;
  ForEach([&target, extendee, stream, extension_set](int number,
                                                     const Extension& ext) {
    target = ext.InternalSerializeMessageSetItemWithCachedSizesToArray(
        extendee, extension_set, number, target, stream);
  });
  return target;
}